

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness,
          bool anti_aliased)

{
  float *pfVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  ImDrawVert *pIVar4;
  int iVar5;
  ImDrawIdx IVar6;
  ulong uVar7;
  ImDrawIdx IVar8;
  ulong uVar9;
  undefined8 *puVar10;
  ImDrawIdx IVar11;
  long lVar12;
  long lVar13;
  ImDrawIdx IVar14;
  int iVar15;
  undefined7 in_register_00000081;
  ulong uVar16;
  ImDrawIdx *pIVar17;
  ImDrawIdx IVar18;
  uint uVar19;
  uint uVar20;
  undefined4 in_XMM0_Db;
  float fVar21;
  ImVec2 IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float afStack_78 [2];
  ulong uStack_70;
  ImVec2 IStack_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  int local_48;
  undefined4 local_44;
  ulong local_40;
  undefined8 local_38;
  
  if (points_count < 2) {
    return;
  }
  IVar3 = GImGui->FontTexUvWhitePixel;
  local_60 = (ImVec2)(ulong)(points_count - 1U);
  local_40 = (ulong)(points_count - 1U);
  if (closed) {
    local_40 = (ulong)(uint)points_count;
  }
  local_58.y = (float)in_XMM0_Db;
  local_58.x = thickness;
  iVar15 = (int)local_40;
  if (!anti_aliased || (GImGui->Style).AntiAliasedLines == false) {
    uStack_70 = 0x14bed0;
    PrimReserve(this,iVar15 * 6,iVar15 * 4);
    for (uVar9 = 1; uVar9 - (local_40 & 0xffffffff) != 1; uVar9 = uVar9 + 1) {
      uVar7 = uVar9 & 0xffffffff;
      if ((uint)points_count == uVar9) {
        uVar7 = 0;
      }
      pIVar4 = this->_VtxWritePtr;
      fVar23 = points[uVar9 - 1].x;
      fVar21 = points[uVar7].x - fVar23;
      fVar27 = points[uVar9 - 1].y;
      fVar25 = points[uVar7].y - fVar27;
      fVar24 = fVar21 * fVar21 + fVar25 * fVar25;
      uVar20 = -(uint)(0.0 < fVar24);
      fVar24 = (float)(~uVar20 & 0x3f800000 | (uint)(1.0 / SQRT(fVar24)) & uVar20);
      fVar21 = fVar24 * fVar21 * local_58.x * 0.5;
      fVar24 = fVar24 * fVar25 * local_58.x * 0.5;
      IVar22.y = fVar27 - fVar21;
      IVar22.x = fVar23 + fVar24;
      pIVar4->pos = IVar22;
      pIVar4->uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4->col = col;
      pIVar4[1].pos.x = points[uVar7].x + fVar24;
      pIVar4[1].pos.y = points[uVar7].y - fVar21;
      pIVar4[1].uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4[1].col = col;
      pIVar4[2].pos.x = points[uVar7].x - fVar24;
      pIVar4[2].pos.y = points[uVar7].y + fVar21;
      pIVar4[2].uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4[2].col = col;
      pIVar4[3].pos.x = points[uVar9 - 1].x - fVar24;
      pIVar4[3].pos.y = points[uVar9 - 1].y + fVar21;
      pIVar4[3].uv = IVar3;
      pIVar4 = this->_VtxWritePtr;
      pIVar4[3].col = col;
      this->_VtxWritePtr = pIVar4 + 4;
      uVar20 = this->_VtxCurrentIdx;
      pIVar17 = this->_IdxWritePtr;
      IVar14 = (ImDrawIdx)uVar20;
      *pIVar17 = IVar14;
      pIVar17[1] = IVar14 + 1;
      pIVar17[2] = IVar14 + 2;
      pIVar17[3] = IVar14;
      pIVar17[4] = IVar14 + 2;
      pIVar17[5] = IVar14 + 3;
      this->_IdxWritePtr = pIVar17 + 6;
      this->_VtxCurrentIdx = uVar20 + 4;
    }
    return;
  }
  local_44 = (undefined4)CONCAT71(in_register_00000081,closed);
  local_38 = (ulong)(1.0 < thickness);
  iVar5 = 0xc;
  if (1.0 < thickness) {
    iVar5 = 0x12;
  }
  local_48 = points_count * 3;
  if (1.0 < thickness) {
    local_48 = points_count * 4;
  }
  uStack_70 = 0x14be06;
  PrimReserve(this,iVar5 * iVar15,local_48);
  lVar13 = -((ulong)(uint)(((int)local_38 * 2 + 3) * points_count) * 8 + 0xf & 0xfffffffffffffff0);
  puVar10 = (undefined8 *)((long)&IStack_68 + lVar13);
  uVar7 = (ulong)(uint)points_count;
  lVar12 = -(local_40 & 0xffffffff);
  *(undefined8 *)((long)&uStack_70 + lVar13) = 1;
  for (uVar9 = *(ulong *)((long)&uStack_70 + lVar13); lVar12 + uVar9 != 1; uVar9 = uVar9 + 1) {
    uVar16 = uVar9 & 0xffffffff;
    if (uVar7 == uVar9) {
      uVar16 = 0;
    }
    fVar21 = points[uVar16].x - points[uVar9 - 1].x;
    fVar23 = points[uVar16].y - points[uVar9 - 1].y;
    fVar24 = fVar21 * fVar21 + fVar23 * fVar23;
    uVar20 = -(uint)(0.0 < fVar24);
    fVar24 = (float)(~uVar20 & 0x3f800000 | (uint)(1.0 / SQRT(fVar24)) & uVar20);
    *(ulong *)((long)&uStack_70 + uVar9 * 8 + lVar13) = CONCAT44(fVar24 * -fVar21,fVar24 * fVar23);
  }
  pfVar1 = (float *)(puVar10 + uVar7);
  local_38 = CONCAT44(local_38._4_4_,col) & 0xffffffff00ffffff;
  if ((char)local_44 == '\0') {
    *(undefined8 *)(pfVar1 + -2) = *(undefined8 *)(pfVar1 + -4);
    if (local_58.x <= 1.0) {
      fVar24 = (float)*puVar10;
      fVar21 = (float)((ulong)*puVar10 >> 0x20);
      fVar23 = (*points).x;
      fVar27 = (*points).y;
      *pfVar1 = fVar24 + fVar23;
      pfVar1[1] = fVar21 + fVar27;
      pfVar1[2] = fVar23 - fVar24;
      pfVar1[3] = fVar27 - fVar21;
      uVar16 = (ulong)local_60 & 0xffffffff;
      fVar24 = points[uVar16].x;
      fVar21 = points[uVar16].y;
      uVar9 = (ulong)(uint)((int)local_60.x * 2);
      *(ulong *)(pfVar1 + uVar9 * 2) =
           CONCAT44((float)((ulong)puVar10[uVar16] >> 0x20) + fVar21,(float)puVar10[uVar16] + fVar24
                   );
      *(ulong *)(pfVar1 + uVar9 * 2 + 2) =
           CONCAT44(fVar21 - (float)((ulong)puVar10[uVar16] >> 0x20),fVar24 - (float)puVar10[uVar16]
                   );
      goto LAB_0014c3d0;
    }
    fVar29 = (local_58.x + -1.0) * 0.5;
    fVar24 = fVar29 + 1.0;
    fVar21 = (float)*puVar10;
    fVar23 = (float)((ulong)*puVar10 >> 0x20);
    fVar27 = fVar21 * fVar24;
    fVar25 = fVar23 * fVar24;
    fVar26 = (*points).x;
    fVar28 = (*points).y;
    fVar21 = fVar21 * fVar29;
    fVar23 = fVar23 * fVar29;
    *pfVar1 = fVar27 + fVar26;
    pfVar1[1] = fVar25 + fVar28;
    pfVar1[2] = fVar21 + fVar26;
    pfVar1[3] = fVar23 + fVar28;
    pfVar1[4] = fVar26 - fVar21;
    pfVar1[5] = fVar28 - fVar23;
    pfVar1[6] = fVar26 - fVar27;
    pfVar1[7] = fVar28 - fVar25;
    uVar9 = (ulong)local_60 & 0xffffffff;
    fVar21 = points[uVar9].x;
    fVar23 = points[uVar9].y;
    uVar16 = (ulong)(uint)((int)local_60.x << 2);
    *(ulong *)(pfVar1 + uVar16 * 2) =
         CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) * fVar24 + fVar23,
                  (float)puVar10[uVar9] * fVar24 + fVar21);
    *(ulong *)(pfVar1 + uVar16 * 2 + 2) =
         CONCAT44((float)((ulong)puVar10[uVar9] >> 0x20) * fVar29 + fVar23,
                  (float)puVar10[uVar9] * fVar29 + fVar21);
    *(ulong *)(pfVar1 + uVar16 * 2 + 4) =
         CONCAT44(fVar23 - (float)((ulong)puVar10[uVar9] >> 0x20) * fVar29,
                  fVar21 - (float)puVar10[uVar9] * fVar29);
    *(ulong *)(pfVar1 + uVar16 * 2 + 6) =
         CONCAT44(fVar23 - (float)((ulong)puVar10[uVar9] >> 0x20) * fVar24,
                  fVar21 - (float)puVar10[uVar9] * fVar24);
  }
  else {
    if (local_58.x <= 1.0) {
LAB_0014c3d0:
      uVar20 = this->_VtxCurrentIdx;
      pIVar17 = this->_IdxWritePtr;
      *(undefined8 *)((long)&uStack_70 + lVar13) = 1;
      for (uVar9 = *(ulong *)((long)&uStack_70 + lVar13); lVar12 + uVar9 != 1; uVar9 = uVar9 + 1) {
        uVar16 = uVar9 & 0xffffffff;
        if (uVar7 == uVar9) {
          uVar16 = 0;
        }
        uVar19 = uVar20 + 3;
        if (uVar7 == uVar9) {
          uVar19 = this->_VtxCurrentIdx;
        }
        uVar2 = *(undefined8 *)((long)&uStack_70 + uVar9 * 8 + lVar13);
        fVar24 = ((float)puVar10[uVar16] + (float)uVar2) * 0.5;
        fVar21 = ((float)((ulong)puVar10[uVar16] >> 0x20) + (float)((ulong)uVar2 >> 0x20)) * 0.5;
        fVar23 = fVar24 * fVar24 + fVar21 * fVar21;
        if (1e-06 < fVar23) {
          fVar23 = 1.0 / fVar23;
          fVar27 = 100.0;
          if (fVar23 <= 100.0) {
            fVar27 = fVar23;
          }
          fVar24 = fVar24 * fVar27;
          fVar21 = fVar21 * fVar27;
        }
        fVar23 = points[uVar16].x;
        fVar27 = points[uVar16].y;
        uVar16 = (ulong)(uint)((int)uVar16 * 2);
        *(ulong *)(pfVar1 + uVar16 * 2) = CONCAT44(fVar27 + fVar21,fVar23 + fVar24);
        *(ulong *)(pfVar1 + uVar16 * 2 + 2) = CONCAT44(fVar27 - fVar21,fVar23 - fVar24);
        IVar18 = (ImDrawIdx)uVar19;
        *pIVar17 = IVar18;
        IVar14 = (ImDrawIdx)uVar20;
        pIVar17[1] = IVar14;
        pIVar17[2] = IVar14 + 2;
        pIVar17[3] = IVar14 + 2;
        pIVar17[4] = IVar18 + 2;
        pIVar17[5] = IVar18;
        pIVar17[6] = IVar18 + 1;
        pIVar17[7] = IVar14 + 1;
        pIVar17[8] = IVar14;
        pIVar17[9] = IVar14;
        pIVar17[10] = IVar18;
        pIVar17[0xb] = IVar18 + 1;
        pIVar17 = pIVar17 + 0xc;
        this->_IdxWritePtr = pIVar17;
        uVar20 = uVar19;
      }
      for (lVar13 = 0; uVar7 * 8 - lVar13 != 0; lVar13 = lVar13 + 8) {
        this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar13);
        this->_VtxWritePtr->uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = col;
        pIVar4[1].pos = *(ImVec2 *)((long)puVar10 + lVar13 * 2 + uVar7 * 8);
        this->_VtxWritePtr[1].uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4[1].col = (ImU32)local_38;
        pIVar4[2].pos = *(ImVec2 *)((long)puVar10 + lVar13 * 2 + uVar7 * 8 + 8);
        this->_VtxWritePtr[2].uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4[2].col = (ImU32)local_38;
        this->_VtxWritePtr = pIVar4 + 3;
      }
      goto LAB_0014c54e;
    }
    fVar29 = (local_58.x + -1.0) * 0.5;
    fVar24 = fVar29 + 1.0;
  }
  uVar20 = this->_VtxCurrentIdx;
  pIVar17 = this->_IdxWritePtr;
  *(undefined8 *)((long)&uStack_70 + lVar13) = 1;
  uVar9 = *(ulong *)((long)&uStack_70 + lVar13);
  local_58.x = (float)(int)uVar7;
  local_58.y = (float)(int)(uVar7 >> 0x20);
  local_40 = lVar12;
  for (; local_40 + uVar9 != 1; uVar9 = uVar9 + 1) {
    uVar7 = uVar9 & 0xffffffff;
    if (local_58 == (ImVec2)uVar9) {
      uVar7 = 0;
    }
    uVar19 = uVar20 + 4;
    if (local_58 == (ImVec2)uVar9) {
      uVar19 = this->_VtxCurrentIdx;
    }
    uVar2 = *(undefined8 *)((long)&uStack_70 + uVar9 * 8 + lVar13);
    fVar21 = ((float)puVar10[uVar7] + (float)uVar2) * 0.5;
    fVar23 = ((float)((ulong)puVar10[uVar7] >> 0x20) + (float)((ulong)uVar2 >> 0x20)) * 0.5;
    fVar27 = fVar21 * fVar21 + fVar23 * fVar23;
    if (1e-06 < fVar27) {
      fVar27 = 1.0 / fVar27;
      fVar25 = 100.0;
      if (fVar27 <= 100.0) {
        fVar25 = fVar27;
      }
      fVar21 = fVar21 * fVar25;
      fVar23 = fVar23 * fVar25;
    }
    fVar27 = points[uVar7].x;
    fVar25 = points[uVar7].y;
    uVar7 = (ulong)(uint)((int)uVar7 * 4);
    *(ulong *)(pfVar1 + uVar7 * 2) = CONCAT44(fVar25 + fVar24 * fVar23,fVar27 + fVar24 * fVar21);
    *(ulong *)(pfVar1 + uVar7 * 2 + 2) = CONCAT44(fVar25 + fVar23 * fVar29,fVar27 + fVar21 * fVar29)
    ;
    *(ulong *)(pfVar1 + uVar7 * 2 + 4) = CONCAT44(fVar25 - fVar23 * fVar29,fVar27 - fVar21 * fVar29)
    ;
    *(ulong *)(pfVar1 + uVar7 * 2 + 6) = CONCAT44(fVar25 - fVar24 * fVar23,fVar27 - fVar24 * fVar21)
    ;
    IVar14 = (ImDrawIdx)uVar19;
    IVar8 = IVar14 + 1;
    *pIVar17 = IVar8;
    IVar18 = (ImDrawIdx)uVar20;
    pIVar17[1] = IVar18 + 1;
    IVar11 = IVar18 + 2;
    pIVar17[2] = IVar11;
    pIVar17[3] = IVar11;
    IVar6 = IVar14 + 2;
    pIVar17[4] = IVar6;
    pIVar17[5] = IVar8;
    pIVar17[6] = IVar8;
    pIVar17[7] = IVar18 + 1;
    pIVar17[8] = IVar18;
    pIVar17[9] = IVar18;
    pIVar17[10] = IVar14;
    pIVar17[0xb] = IVar8;
    pIVar17[0xc] = IVar6;
    pIVar17[0xd] = IVar11;
    pIVar17[0xe] = IVar18 + 3;
    pIVar17[0xf] = IVar18 + 3;
    pIVar17[0x10] = IVar14 + 3;
    pIVar17[0x11] = IVar6;
    pIVar17 = pIVar17 + 0x12;
    this->_IdxWritePtr = pIVar17;
    uVar20 = uVar19;
  }
  for (lVar13 = 0; (long)local_58 << 5 != lVar13; lVar13 = lVar13 + 0x20) {
    this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar10 + lVar13 + (long)local_58 * 8);
    this->_VtxWritePtr->uv = IVar3;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = (ImU32)local_38;
    pIVar4[1].pos = *(ImVec2 *)((long)puVar10 + lVar13 + (long)local_58 * 8 + 8);
    this->_VtxWritePtr[1].uv = IVar3;
    pIVar4 = this->_VtxWritePtr;
    pIVar4[1].col = col;
    pIVar4[2].pos = *(ImVec2 *)((long)puVar10 + lVar13 + (long)local_58 * 8 + 0x10);
    this->_VtxWritePtr[2].uv = IVar3;
    pIVar4 = this->_VtxWritePtr;
    pIVar4[2].col = col;
    pIVar4[3].pos = *(ImVec2 *)((long)puVar10 + lVar13 + (long)local_58 * 8 + 0x18);
    this->_VtxWritePtr[3].uv = IVar3;
    pIVar4 = this->_VtxWritePtr;
    pIVar4[3].col = (ImU32)local_38;
    this->_VtxWritePtr = pIVar4 + 4;
  }
LAB_0014c54e:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_48;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness, bool anti_aliased)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = GImGui->FontTexUvWhitePixel;
    anti_aliased &= GImGui->Style.AntiAliasedLines;
    //if (ImGui::GetIO().KeyCtrl) anti_aliased = false; // Debug

    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = thickness > 1.0f;
    if (anti_aliased)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & 0x00ffffff;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2));
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            ImVec2 diff = points[i2] - points[i1];
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i1].x = diff.y;
            temp_normals[i1].y = -diff.x;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                dm *= AA_SIZE;
                temp_points[i2*2+0] = points[i2] + dm;
                temp_points[i2*2+1] = points[i2] - dm;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+0] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
                temp_points[(points_count-1)*4+1] = points[points_count-1] + temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+2] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness);
                temp_points[(points_count-1)*4+3] = points[points_count-1] - temp_normals[points_count-1] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+4;

                // Average normals
                ImVec2 dm = (temp_normals[i1] + temp_normals[i2]) * 0.5f;
                float dmr2 = dm.x*dm.x + dm.y*dm.y;
                if (dmr2 > 0.000001f)
                {
                    float scale = 1.0f / dmr2;
                    if (scale > 100.0f) scale = 100.0f;
                    dm *= scale;
                }
                ImVec2 dm_out = dm * (half_inner_thickness + AA_SIZE);
                ImVec2 dm_in = dm * half_inner_thickness;
                temp_points[i2*4+0] = points[i2] + dm_out;
                temp_points[i2*4+1] = points[i2] + dm_in;
                temp_points[i2*4+2] = points[i2] - dm_in;
                temp_points[i2*4+3] = points[i2] - dm_out;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1+2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2+2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2+1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1+1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1+0); _IdxWritePtr[10] = (ImDrawIdx)(idx2+0); _IdxWritePtr[11] = (ImDrawIdx)(idx2+1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2+2); _IdxWritePtr[13] = (ImDrawIdx)(idx1+2); _IdxWritePtr[14] = (ImDrawIdx)(idx1+3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1+3); _IdxWritePtr[16] = (ImDrawIdx)(idx2+3); _IdxWritePtr[17] = (ImDrawIdx)(idx2+2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertexes
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i*4+0]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i*4+1]; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i*4+2]; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i*4+3]; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];
            ImVec2 diff = p2 - p1;
            diff *= ImInvLength(diff, 1.0f);

            const float dx = diff.x * (thickness * 0.5f);
            const float dy = diff.y * (thickness * 0.5f);
            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}